

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

ValidationContext __thiscall
VmaBlockBufferImageGranularity::StartValidation
          (VmaBlockBufferImageGranularity *this,VkAllocationCallbacks *pAllocationCallbacks,
          bool isVirutal)

{
  uint16_t *__s;
  undefined7 in_register_00000011;
  ValidationContext VVar1;
  
  __s = (uint16_t *)0x0;
  if (((int)CONCAT71(in_register_00000011,isVirutal) == 0) &&
     (0x100 < this->m_BufferImageGranularity)) {
    __s = (uint16_t *)VmaMalloc(pAllocationCallbacks,(ulong)this->m_RegionCount * 2,2);
    memset(__s,0,(ulong)this->m_RegionCount * 2);
  }
  VVar1.pageAllocs = __s;
  VVar1.allocCallbacks = pAllocationCallbacks;
  return VVar1;
}

Assistant:

VmaBlockBufferImageGranularity::ValidationContext VmaBlockBufferImageGranularity::StartValidation(
    const VkAllocationCallbacks* pAllocationCallbacks, bool isVirutal) const
{
    ValidationContext ctx{ pAllocationCallbacks, VMA_NULL };
    if (!isVirutal && IsEnabled())
    {
        ctx.pageAllocs = vma_new_array(pAllocationCallbacks, uint16_t, m_RegionCount);
        memset(ctx.pageAllocs, 0, m_RegionCount * sizeof(uint16_t));
    }
    return ctx;
}